

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_EscapeEncoding.cpp
# Opt level: O0

size_t axl::enc::EscapeEncodingDynamic::encode
                 (CharCodec *codec,Array<char,_axl::sl::ArrayDetails<char>_> *buffer,void *p0,
                 size_t size,uint_t flags)

{
  bool bVar1;
  CharCodec *finalBuffer;
  CharCodec *codec_00;
  size_t sVar2;
  long in_RCX;
  ulong in_RDX;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *in_RSI;
  long *in_RDI;
  uint_t in_R8D;
  undefined1 auVar3 [16];
  size_t escapeSequenceLength;
  utf32_t escape;
  utf32_t c;
  utf32_t *base;
  utf32_t *end;
  utf32_t *p;
  ConvertLengthResult result;
  utf32_t decodeBuffer [64];
  char *srcEnd;
  char *src;
  uint32_t decoderState;
  char escapeSequence [16];
  Array<char,_axl::sl::ArrayDetails<char>_> encodeBuffer;
  utf32_t in_stack_fffffffffffffe04;
  char *in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe40;
  utf32_t in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  CharCodec *encodeBuffer_00;
  CharCodec local_178 [264];
  ulong local_70;
  ulong local_68;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 local_50;
  uint_t local_24;
  long local_20;
  ulong local_18;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *local_10;
  long *local_8;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::clear
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1a274c);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::reserve
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),in_stack_fffffffffffffe40
            );
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1a276e);
  local_58 = 0x5c;
  local_50 = 0;
  local_5c = 0;
  local_68 = local_18;
  local_70 = local_18 + local_20;
  while (local_68 < local_70) {
    auVar3 = (**(code **)(*local_8 + 0x98))
                       (local_8,&local_5c,local_178,0x40,local_68,local_70 - local_68,0xfffd);
    if (auVar3._8_8_ == 0) break;
    local_68 = auVar3._8_8_ + local_68;
    encodeBuffer_00 = local_178;
    finalBuffer = encodeBuffer_00 + auVar3._0_8_ * 4;
    for (codec_00 = encodeBuffer_00; codec_00 < finalBuffer; codec_00 = codec_00 + 4) {
      in_stack_fffffffffffffe4c = *(int *)codec_00;
      if (in_stack_fffffffffffffe4c == 0x5c) {
        local_58._0_2_ = CONCAT11(0x5c,(undefined1)local_58);
        appendEncoded_utf32(codec_00,(Array<char,_axl::sl::ArrayDetails<char>_> *)finalBuffer,
                            (Array<char,_axl::sl::ArrayDetails<char>_> *)encodeBuffer_00,
                            (utf32_t *)CONCAT44(0x5c,in_stack_fffffffffffffe48),
                            in_stack_fffffffffffffe40);
        appendEncoded_utf8(codec_00,(Array<char,_axl::sl::ArrayDetails<char>_> *)finalBuffer,
                           (Array<char,_axl::sl::ArrayDetails<char>_> *)encodeBuffer_00,
                           (utf8_t *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                           in_stack_fffffffffffffe40);
LAB_001a2a85:
        encodeBuffer_00 = codec_00 + 4;
      }
      else {
        bVar1 = isPrintable(in_stack_fffffffffffffe4c);
        if ((!bVar1) &&
           (in_stack_fffffffffffffe48 =
                 EscapeEncodingRoot::findEscapeChar(in_stack_fffffffffffffe4c,local_24),
           in_stack_fffffffffffffe48 != 0)) {
          appendEncoded_utf32(codec_00,(Array<char,_axl::sl::ArrayDetails<char>_> *)finalBuffer,
                              (Array<char,_axl::sl::ArrayDetails<char>_> *)encodeBuffer_00,
                              (utf32_t *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                              in_stack_fffffffffffffe40);
          if (in_stack_fffffffffffffe48 == in_stack_fffffffffffffe4c) {
            if ((local_24 & 1) == 0) {
              in_stack_fffffffffffffe40 =
                   EscapeEncodingRoot::buildHexCodeEscapeSequence<axl::enc::GetHexChar_l,char>
                             (in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
            }
            else {
              in_stack_fffffffffffffe40 =
                   EscapeEncodingRoot::buildHexCodeEscapeSequence<axl::enc::GetHexChar_u,char>
                             (in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
            }
          }
          else {
            local_58._0_2_ = CONCAT11((char)in_stack_fffffffffffffe48,(undefined1)local_58);
            in_stack_fffffffffffffe40 = 2;
          }
          appendEncoded_utf8(codec_00,(Array<char,_axl::sl::ArrayDetails<char>_> *)finalBuffer,
                             (Array<char,_axl::sl::ArrayDetails<char>_> *)encodeBuffer_00,
                             (utf8_t *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                             ,in_stack_fffffffffffffe40);
          goto LAB_001a2a85;
        }
      }
    }
    appendEncoded_utf32(codec_00,(Array<char,_axl::sl::ArrayDetails<char>_> *)finalBuffer,
                        (Array<char,_axl::sl::ArrayDetails<char>_> *)encodeBuffer_00,
                        (utf32_t *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                        in_stack_fffffffffffffe40);
  }
  sVar2 = sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(local_10);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1a2af0);
  return sVar2;
}

Assistant:

size_t
EscapeEncodingDynamic::encode(
	CharCodec* codec,
	sl::Array<char>* buffer,
	const void* p0,
	size_t size,
	uint_t flags
) {
	buffer->clear();
	buffer->reserve(size);

	sl::Array<char> encodeBuffer;
	char escapeSequence[16] = { '\\' };

	uint32_t decoderState = 0;
	const char* src = (char*)p0;
	const char* srcEnd = src + size;

	while (src < srcEnd) {
		utf32_t decodeBuffer[64];

		ConvertLengthResult result = codec->decode_utf32(
			&decoderState,
			decodeBuffer,
			countof(decodeBuffer),
			src,
			srcEnd - src
		);

		if (!result.m_srcLength)
			break;

		src += result.m_srcLength;

		const utf32_t* p = decodeBuffer;
		const utf32_t* end = p + result.m_dstLength;
		const utf32_t* base = p;

		for (; p < end; p++) {
			utf32_t c = *p;

			if (c == '\\') {
				escapeSequence[1] = '\\';
				appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);
				appendEncoded_utf8(codec, buffer, &encodeBuffer, escapeSequence, 2);
				base = p + 1;
			} else {
				if (isPrintable(c))
					continue;

				utf32_t escape = findEscapeChar(c, flags);
				if (!escape)
					continue;

				appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);

				size_t escapeSequenceLength;
				if (escape != c) {
					escapeSequence[1] = (char)escape;
					escapeSequenceLength = 2;
				} else {
					escapeSequenceLength = (flags & EscapeEncodingFlag_UpperCase) ?
						buildHexCodeEscapeSequence<GetHexChar_u>(escapeSequence, c) :
						buildHexCodeEscapeSequence<GetHexChar_l>(escapeSequence, c);
				}

				appendEncoded_utf8(codec, buffer, &encodeBuffer, escapeSequence, escapeSequenceLength);
				base = p + 1;
			}
		}

		appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);
	}

	return buffer->getCount();
}